

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestBase.h
# Opt level: O2

void CHECK_DOUBLE(char *var,uint index,double expected,bool *lastFailed)

{
  ulong uVar1;
  void *pvVar2;
  double *data;
  double dVar3;
  
  uVar1 = (ulong)index;
  pvVar2 = Tests::FindVar(var);
  if (pvVar2 == (void *)0x0) {
    if (Tests::lastMessage != 0) {
      printf("%s\r\n");
    }
    printf(" Failed to find variable %s\r\n",var);
  }
  else {
    dVar3 = *(double *)((long)pvVar2 + uVar1 * 8);
    if (ABS(dVar3 - expected) <= 1e-06) {
      return;
    }
    if (Tests::lastMessage != 0) {
      printf("%s\r\n",expected);
      dVar3 = *(double *)((long)pvVar2 + uVar1 * 8);
    }
    printf(" Failed %s[%d] == %f (got %f)\r\n",expected,dVar3,var,uVar1);
  }
  *lastFailed = true;
  return;
}

Assistant:

inline void CHECK_DOUBLE(const char *var, unsigned index, double expected, bool &lastFailed)
{
	if(void *variablePtr = Tests::FindVar(var))
	{
		double *data = (double*)variablePtr;

		if(fabs(data[index] - expected) > 1e-6)
		{
			if(Tests::lastMessage)
				printf("%s\r\n", Tests::lastMessage);

			printf(" Failed %s[%d] == %f (got %f)\r\n", var, index, (double)expected, data[index]);
			lastFailed = true;
		}
	}
	else
	{
		if(Tests::lastMessage)
			printf("%s\r\n", Tests::lastMessage);

		printf(" Failed to find variable %s\r\n", var);
		lastFailed = true;
	}
}